

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O0

string * __thiscall
TestNLHandler::MakeVarArg
          (TestNLHandler *this,string *op,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  BasicWriter<char> *pBVar1;
  BasicMemoryWriter<char,_std::allocator<char>_> *in_RDX;
  string *in_RDI;
  MemoryWriter w;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd68;
  char value;
  allocator<char> *alloc;
  BasicMemoryWriter<char,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  BasicStringRef<char> in_stack_fffffffffffffd98;
  BasicWriter<char> *in_stack_fffffffffffffda8;
  Writer *in_stack_fffffffffffffdb0;
  
  alloc = (allocator<char> *)&stack0xfffffffffffffdb7;
  std::allocator<char>::allocator();
  fmt::BasicMemoryWriter<char,_std::allocator<char>_>::BasicMemoryWriter
            (in_stack_fffffffffffffd90,alloc);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdb7);
  fmt::BasicStringRef<char>::BasicStringRef
            ((BasicStringRef<char> *)in_RDX,in_stack_fffffffffffffd68);
  pBVar1 = fmt::BasicWriter<char>::operator<<
                     (&in_stack_fffffffffffffd90->super_BasicWriter<char>,in_stack_fffffffffffffd98)
  ;
  value = (char)((ulong)pBVar1 >> 0x38);
  fmt::BasicWriter<char>::operator<<(&in_RDX->super_BasicWriter<char>,value);
  WriteList<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_fffffffffffffdb0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffda8);
  fmt::BasicWriter<char>::operator<<(&in_RDX->super_BasicWriter<char>,value);
  fmt::BasicWriter<char>::str_abi_cxx11_(in_stack_fffffffffffffda8);
  fmt::BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter(in_RDX);
  return in_RDI;
}

Assistant:

std::string MakeVarArg(std::string op, const std::vector<std::string> &args) {
    fmt::MemoryWriter w;
    w << op << '(';
    WriteList(w, args);
    w << ')';
    return w.str();
  }